

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::generate_verilog_no_pkg_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top,SystemVerilogCodeGenOptions *options)

{
  _Rb_tree_header *p_Var1;
  pointer *__alloc;
  __pthread_internal_list **__return_storage_ptr___00;
  pointer __first;
  pointer __last;
  pointer __last_00;
  pointer pfVar2;
  uint32_t uVar3;
  pointer p_Var4;
  infinite_counter<unsigned_long,_18446744073709551615UL> *__args_1;
  pointer __result;
  priority_task *ppVar5;
  _Base_ptr p_Var6;
  thread_pool_error *this_00;
  undefined1 this_01 [8];
  infinite_counter<unsigned_long,_18446744073709551615UL> *in_R8;
  undefined1 local_250 [8];
  UniqueGeneratorVisitor unique_visitor;
  thread_pool pool;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  r;
  undefined1 auStack_98 [8];
  vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  tasks;
  future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t;
  anon_class_16_1_80eb7a8b local_60;
  undefined1 local_50 [8];
  shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>_>
  pack_task;
  __allocator_type __a2;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  unique_visitor.super_IRVisitor._8_8_ =
       &unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  unique_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  unique_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  unique_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_250 = (undefined1  [8])&PTR_visit_root_002b3bf8;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&unique_visitor.generator_map_;
  unique_visitor.generator_map_._M_t._M_impl._0_4_ = 0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  IRVisitor::visit_generator_root((IRVisitor *)local_250,(Generator *)this);
  uVar3 = get_num_cpus();
  cxxpool::thread_pool::thread_pool
            ((thread_pool *)
             &unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (ulong)uVar3);
  auStack_98 = (undefined1  [8])0x0;
  tasks.
  super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tasks.
  super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::reserve((vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)auStack_98,
            (size_type)
            unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  p_Var6 = unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_60.pack_task.
  super___shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
  while( true ) {
    pfVar2 = tasks.
             super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var6 == (_Base_ptr)&unique_visitor.generator_map_) {
      __return_storage_ptr___00 =
           &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next;
      for (this_01 = auStack_98; this_01 != (undefined1  [8])pfVar2;
          this_01 = (undefined1  [8])((long)this_01 + 0x10)) {
        std::
        future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::get((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__return_storage_ptr___00,
              (future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)__return_storage_ptr__,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)__return_storage_ptr___00);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)__return_storage_ptr___00);
      }
      track_generators((Generator *)this);
      std::
      vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)auStack_98);
      cxxpool::thread_pool::~thread_pool
                ((thread_pool *)
                 &unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      UniqueGeneratorVisitor::~UniqueGeneratorVisitor((UniqueGeneratorVisitor *)local_250);
      return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
    }
    local_60.pack_task.
    super___shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)top;
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>
    ::_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>
                   *)&r,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var6 + 1),(Generator **)(p_Var6 + 2));
    local_50 = (undefined1  [8])0x0;
    p_Var4 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_std::allocator<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate((allocator_type *)&stack0xffffffffffffffcf,1);
    (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_002b3db0;
    t.
    super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffcf;
    std::
    __create_task_state<std::pair<std::__cxx11::string,std::__cxx11::string>(),std::_Bind<kratos::generate_verilog_no_pkg(kratos::Generator*,kratos::SystemVerilogCodeGenOptions)::__0(std::__cxx11::string,kratos::Generator*)>,std::allocator<int>>
              ((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src_codegen_cc:1405:13)_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*)>
                *)&p_Var4->_M_impl,
               (allocator<int> *)
               &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
    local_50 = (undefined1  [8])&p_Var4->_M_impl;
    pack_task.
    super___shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)p_Var4;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_std::allocator<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_std::allocator<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&t.
                           super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    std::__cxx11::string::~string((string *)&r.first._M_string_length);
    std::
    packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>
    ::get_future((packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>
                  *)&tasks.
                     super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::mutex::lock((mutex *)&pool.field_0x80);
    r.second.field_2._8_8_ = p_Var6;
    if ((char)unique_visitor.generator_map_._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        '\x01') break;
    std::
    __shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
                    *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next,
                   (__shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_50);
    __args_1 = cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>::operator++
                         ((infinite_counter<unsigned_long,_18446744073709551615UL> *)
                          &pool.tasks_.field_0x18);
    __last = pool.tasks_.c.
             super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        pool.tasks_.c.
        super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pack_task.
      super___shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>::
           _M_check_len((vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                         *)&pool.threads_.
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,1,"vector::_M_realloc_insert")
      ;
      __last_00 = pool.tasks_.c.
                  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      __first = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      __result = std::
                 _Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ::_M_allocate((_Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                                *)&pool.threads_.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_t)pack_task.
                                       super___shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
      std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
      construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                ((allocator_type *)(((long)__last - (long)__first) + (long)__result),
                 (priority_task *)
                 &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next,&local_60,
                 (unsigned_long *)__args_1,in_R8);
      __alloc = &pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      ppVar5 = std::
               __relocate_a_1<cxxpool::detail::priority_task*,cxxpool::detail::priority_task*,std::allocator<cxxpool::detail::priority_task>>
                         ((priority_task *)__first,__last,__result,
                          (allocator<cxxpool::detail::priority_task> *)__alloc);
      ppVar5 = std::
               __relocate_a_1<cxxpool::detail::priority_task*,cxxpool::detail::priority_task*,std::allocator<cxxpool::detail::priority_task>>
                         (__last,__last_00,ppVar5 + 1,
                          (allocator<cxxpool::detail::priority_task> *)__alloc);
      __return_storage_ptr__ =
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_60.pack_task.
              super___shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
      std::
      _Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ::_M_deallocate((_Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                       *)__alloc,(pointer)__first,
                      (long)pool.tasks_.c.
                            super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)__first >> 6);
      pool.tasks_.c.
      super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           __result +
           (long)pack_task.
                 super___shared_ptr<std::packaged_task<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_()>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)__result;
    }
    else {
      std::allocator_traits<std::allocator<cxxpool::detail::priority_task>_>::
      construct<cxxpool::detail::priority_task,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_src____extern_cxxpool_src_cxxpool_h:371:28),_unsigned_long_&,_cxxpool::detail::infinite_counter<unsigned_long,_18446744073709551615UL>_&>
                ((allocator_type *)
                 pool.tasks_.c.
                 super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (priority_task *)
                 &pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next,&local_60,
                 (unsigned_long *)__args_1,in_R8);
      ppVar5 = pool.tasks_.c.
               super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    pool.tasks_.c.
    super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar5;
    std::
    push_heap<__gnu_cxx::__normal_iterator<cxxpool::detail::priority_task*,std::vector<cxxpool::detail::priority_task,std::allocator<cxxpool::detail::priority_task>>>,std::less<cxxpool::detail::priority_task>>
              (pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,ppVar5);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&r);
    pthread_mutex_unlock((pthread_mutex_t *)&pool.field_0x80);
    std::condition_variable::notify_one();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pack_task);
    std::
    vector<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
    ::emplace_back<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              ((vector<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::future<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                *)auStack_98,
               (future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&tasks.
                   super__Vector_base<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t);
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)r.second.field_2._8_8_);
  }
  this_00 = (thread_pool_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next,
             "push called while pool is shutting down",
             (allocator<char> *)
             &t.
              super___basic_future<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cxxpool::thread_pool_error::thread_pool_error
            (this_00,(string *)&pool.thread_mutex_.super___mutex_base._M_mutex.__data.__list.__next)
  ;
  __cxa_throw(this_00,&cxxpool::thread_pool_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::map<std::string, std::string> generate_verilog_no_pkg(Generator* top,
                                                           SystemVerilogCodeGenOptions options) {
    // this pass assumes that all the generators has been uniquified
    std::map<std::string, std::string> result;
    // first get all the unique generators
    UniqueGeneratorVisitor unique_visitor;
    // this can be parallelized
    unique_visitor.visit_generator_root(top);
    auto const& generator_map = unique_visitor.generator_map();
    // codegen in parallel
    uint32_t num_cpus = get_num_cpus();
    cxxpool::thread_pool pool{num_cpus};
    std::vector<std::future<std::pair<std::string, std::string>>> tasks;
    tasks.reserve(generator_map.size());
    for (const auto& [module_name, module_gen] : generator_map) {
        auto t = pool.push(
            [&options](const std::string& name, Generator* g) {
                SystemVerilogCodeGen codegen(g, options);
                return std::pair(name, codegen.str());
            },
            module_name, module_gen);
        tasks.emplace_back(std::move(t));
    }
    for (auto& t : tasks) {
        auto r = t.get();
        result.emplace(r);
    }

    track_generators(top);
    return result;
}